

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void Catch::defaultListTags
               (ostream *out,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
               bool isFiltered)

{
  pointer pTVar1;
  ReusableStringStream *this;
  ostream *os;
  undefined7 in_register_00000011;
  char *pcVar2;
  pointer this_00;
  ReusableStringStream rss;
  string str;
  Column local_c0;
  string local_88;
  Column wrapper;
  
  pcVar2 = "All available tags:\n";
  if ((int)CONCAT71(in_register_00000011,isFiltered) != 0) {
    pcVar2 = "Tags for matching test cases:\n";
  }
  std::operator<<(out,pcVar2);
  pTVar1 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl
                 .super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1) {
    ReusableStringStream::ReusableStringStream(&rss);
    std::operator<<(rss.m_oss,"  ");
    *(undefined8 *)(rss.m_oss + *(long *)(*(long *)rss.m_oss + -0x18) + 0x10) = 2;
    this = ReusableStringStream::operator<<(&rss,&this_00->count);
    ReusableStringStream::operator<<(this,(char (*) [3])0x1ce80b);
    std::__cxx11::stringbuf::str();
    TagInfo::all_abi_cxx11_(&local_88,this_00);
    TextFlow::Column::Column(&local_c0,&local_88);
    local_c0.m_initialIndent = 0;
    local_c0.m_indent = str._M_string_length;
    local_c0.m_width = 0x46;
    TextFlow::Column::Column(&wrapper,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_88);
    os = std::operator<<(out,(string *)&str);
    TextFlow::operator<<(os,&wrapper);
    std::operator<<(os,'\n');
    std::__cxx11::string::~string((string *)&wrapper);
    std::__cxx11::string::~string((string *)&str);
    ReusableStringStream::~ReusableStringStream(&rss);
  }
  wrapper.m_string._M_dataplus._M_p =
       (pointer)(((long)(tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>).
                       _M_impl.super__Vector_impl_data._M_start) / 0x38);
  wrapper.m_string._M_string_length = (size_type)anon_var_dwarf_ad862;
  wrapper.m_string.field_2._M_allocated_capacity = 3;
  operator<<(out,(pluralise *)&wrapper);
  std::operator<<(out,"\n\n");
  std::ostream::flush();
  return;
}

Assistant:

void defaultListTags( std::ostream& out,
                          std::vector<TagInfo> const& tags,
                          bool isFiltered ) {
        if ( isFiltered ) {
            out << "Tags for matching test cases:\n";
        } else {
            out << "All available tags:\n";
        }

        for ( auto const& tagCount : tags ) {
            ReusableStringStream rss;
            rss << "  " << std::setw( 2 ) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column( tagCount.all() )
                               .initialIndent( 0 )
                               .indent( str.size() )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - 10 );
            out << str << wrapper << '\n';
        }
        out << pluralise(tags.size(), "tag"_sr) << "\n\n" << std::flush;
    }